

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O0

__pid_t __thiscall kmp_flag_32::wait(kmp_flag_32 *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  void *unaff_retaddr;
  int in_stack_0000000c;
  kmp_flag_32 *in_stack_00000010;
  kmp_info_t *in_stack_00000018;
  
  __kmp_wait_template<kmp_flag_32>
            (in_stack_00000018,in_stack_00000010,in_stack_0000000c,unaff_retaddr);
  return extraout_EAX;
}

Assistant:

void wait(kmp_info_t *this_thr, int final_spin
              USE_ITT_BUILD_ARG(void * itt_sync_obj)) {
        __kmp_wait_template(this_thr, this, final_spin
                            USE_ITT_BUILD_ARG(itt_sync_obj));
    }